

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

size_t pstore::sparse_array<unsigned_int,unsigned_short>::required_bytes<unsigned_long_const*>
                 (size_t count,unsigned_long *first,unsigned_long *last)

{
  unsigned_short x;
  uint *puVar1;
  uint local_2c;
  uint local_28 [2];
  unsigned_long *puStack_20;
  uint elements;
  unsigned_long *last_local;
  unsigned_long *first_local;
  size_t count_local;
  
  puStack_20 = last;
  last_local = first;
  first_local = (unsigned_long *)count;
  x = bitmap<unsigned_long_const*,void>(first,last);
  local_28[0] = bit_count::pop_count(x);
  local_2c = 1;
  puVar1 = std::max<unsigned_int>(local_28,&local_2c);
  return (long)first_local + (ulong)*puVar1 * 4 + -4;
}

Assistant:

static std::size_t required_bytes (std::size_t const count, InputIterator const first,
                                           InputIterator const last) {
            // There will always be sufficient storage for at least 1 instance of
            // ValueType (this comes from the built-in array).
            static_assert (sizeof (elements_) / sizeof (ValueType) == 1U,
                           "Expected elements_ to be an array of 1 ValueType");
            auto const elements = std::max (bit_count::pop_count (bitmap (first, last)), 1U);
            return count - sizeof (elements_) + elements * sizeof (ValueType);
        }